

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainCache.cpp
# Opt level: O2

bool parseParameters(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  
  lVar2 = 1;
  pcVar3 = traceFilePath;
  do {
    if (argc <= lVar2) {
      return pcVar3 != (char *)0x0;
    }
    pcVar4 = argv[lVar2];
    if (*pcVar4 == '-') {
      pcVar1 = traceFilePath;
      if (pcVar4[1] == 's') {
        isSingleStep = true;
        pcVar4 = pcVar3;
      }
      else {
        if (pcVar4[1] != 'v') {
          return false;
        }
        verbose = true;
        pcVar4 = pcVar3;
      }
    }
    else {
      pcVar1 = pcVar4;
      if (pcVar3 != (char *)0x0) {
        return false;
      }
    }
    traceFilePath = pcVar1;
    lVar2 = lVar2 + 1;
    pcVar3 = pcVar4;
  } while( true );
}

Assistant:

bool parseParameters(int argc, char **argv) {
  // Read Parameters
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '-') {
      switch (argv[i][1]) {
      case 'v':
        verbose = 1;
        break;
      case 's':
        isSingleStep = 1;
        break;
      default:
        return false;
      }
    } else {
      if (traceFilePath == nullptr) {
        traceFilePath = argv[i];
      } else {
        return false;
      }
    }
  }
  if (traceFilePath == nullptr) {
    return false;
  }
  return true;
}